

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O1

SUNErrCode SUNProfiler_Print(SUNProfiler p,FILE *fp)

{
  undefined8 uVar1;
  SUNHashMapKeyValue pSVar2;
  char *__s1;
  void *pvVar3;
  SUNErrCode SVar4;
  int iVar5;
  int64_t iVar6;
  SUNErrCode SVar7;
  SUNProfiler p_1;
  long lVar8;
  double dVar9;
  SUNHashMapKeyValue *sorted;
  sunTimerStruct *timer;
  sunTimespec spec;
  SUNHashMapKeyValue *local_58;
  void *local_50;
  double local_48;
  timespec local_40;
  
  local_50 = (void *)0x0;
  local_58 = (SUNHashMapKeyValue *)0x0;
  if (p == (SUNProfiler)0x0) {
    SVar7 = -9999;
  }
  else {
    clock_gettime(1,(timespec *)p->overhead->tic);
    iVar6 = SUNHashMap_GetValue(p->map,"From profiler epoch",&local_50);
    if (iVar6 == -99) {
      SVar7 = -0x26fd;
    }
    else if (iVar6 == -1) {
      SVar7 = -0x26fb;
    }
    else {
      p->sundials_time = *(double *)((long)local_50 + 0x20);
      SVar4 = SUNHashMap_Sort(p->map,&local_58,sunCompareTimes);
      SVar7 = -0x26fa;
      if (SVar4 == 0) {
        clock_getres(1,&local_40);
        fwrite("\n================================================================================================================\n"
               ,0x72,1,(FILE *)fp);
        SVar7 = 0;
        fprintf((FILE *)fp,"SUNDIALS GIT VERSION: %s\n","v7.3.0");
        fprintf((FILE *)fp,"SUNDIALS PROFILER: %s\n",p->title);
        fprintf((FILE *)fp,"TIMER RESOLUTION: %gs\n",(double)local_40.tv_nsec * 1e-09);
        fprintf((FILE *)fp,"%-40s\t %% time (inclusive) \t max/rank \t average/rank \t count \n",
                "RESULTS:");
        fwrite("================================================================================================================\n"
               ,0x71,1,(FILE *)fp);
        iVar6 = SUNHashMap_Capacity(p->map);
        if (0 < iVar6) {
          lVar8 = 0;
          do {
            pSVar2 = local_58[lVar8];
            if (pSVar2 != (SUNHashMapKeyValue)0x0) {
              __s1 = pSVar2->key;
              pvVar3 = pSVar2->value;
              uVar1 = *(undefined8 *)((long)pvVar3 + 0x10);
              local_48 = *(double *)((long)pvVar3 + 0x18);
              iVar5 = strcmp(__s1,"From profiler epoch");
              dVar9 = 100.0;
              if (iVar5 != 0) {
                dVar9 = (local_48 / p->sundials_time) * 100.0;
              }
              fprintf((FILE *)fp,"%-40s\t %6.2f%% \t         %.6fs \t %.6fs \t %ld\n",dVar9,local_48
                      ,uVar1,__s1,*(undefined8 *)((long)pvVar3 + 0x28));
            }
            lVar8 = lVar8 + 1;
            iVar6 = SUNHashMap_Capacity(p->map);
          } while (lVar8 < iVar6);
        }
        free(local_58);
        sunStopTiming(p->overhead);
        fprintf((FILE *)fp,"%-40s\t %6.2f%% \t         %.6fs \t -- \t\t -- \n",
                p->overhead->elapsed / p->sundials_time,"Est. profiler overhead");
        fputc(10,(FILE *)fp);
      }
    }
  }
  return SVar7;
}

Assistant:

SUNErrCode SUNProfiler_Print(SUNProfiler p, FILE* fp)
{
  int64_t ier                = 0;
  int rank                   = 0;
  sunTimerStruct* timer      = NULL;
  SUNHashMapKeyValue* sorted = NULL;

  if (!p) { return SUN_ERR_ARG_CORRUPT; }

  sunStartTiming(p->overhead);

  /* Get the total SUNDIALS time up to this point */
  SUNDIALS_MARK_END(p, SUNDIALS_ROOT_TIMER);
  SUNDIALS_MARK_BEGIN(p, SUNDIALS_ROOT_TIMER);

  ier = SUNHashMap_GetValue(p->map, SUNDIALS_ROOT_TIMER, (void**)&timer);
  if (ier == SUNHASHMAP_ERROR) { return SUN_ERR_PROFILER_MAPGET; }
  if (ier == SUNHASHMAP_KEYNOTFOUND) { return SUN_ERR_PROFILER_MAPKEYNOTFOUND; }
  p->sundials_time = timer->elapsed;

#if SUNDIALS_MPI_ENABLED
  if (p->comm != SUN_COMM_NULL)
  {
    MPI_Comm_rank(p->comm, &rank);
    /* Find the max and average time across all ranks */
    sunCollectTimers(p);
  }
#endif

  if (rank == 0)
  {
    double resolution;
    /* Sort the timers in descending order */
    if (SUNHashMap_Sort(p->map, &sorted, sunCompareTimes))
    {
      return SUN_ERR_PROFILER_MAPSORT;
    }
    SUNProfiler_GetTimerResolution(p, &resolution);
    fprintf(fp, "\n============================================================"
                "====================================================\n");
    fprintf(fp, "SUNDIALS GIT VERSION: %s\n", SUNDIALS_GIT_VERSION);
    fprintf(fp, "SUNDIALS PROFILER: %s\n", p->title);
    fprintf(fp, "TIMER RESOLUTION: %gs\n", resolution);
    fprintf(fp, "%-40s\t %% time (inclusive) \t max/rank \t average/rank \t count \n",
            "RESULTS:");
    fprintf(fp, "=============================================================="
                "==================================================\n");

#if SUNDIALS_MPI_ENABLED
    if (p->comm == SUN_COMM_NULL)
    {
      printf(
        "WARNING: no MPI communicator provided, times shown are for rank 0\n");
    }
#endif

    /* Print all the other timers out */
    for (int64_t i = 0; i < SUNHashMap_Capacity(p->map); i++)
    {
      if (sorted[i]) { sunPrintTimer(sorted[i], fp, (void*)p); }
    }
    free(sorted);
  }

  sunStopTiming(p->overhead);

  if (rank == 0)
  {
    /* Print out the total time and the profiler overhead */
    fprintf(fp, "%-40s\t %6.2f%% \t         %.6fs \t -- \t\t -- \n",
            "Est. profiler overhead", p->overhead->elapsed / p->sundials_time,
            p->overhead->elapsed);

    /* End of output */
    fprintf(fp, "\n");
  }

  return SUN_SUCCESS;
}